

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::DestroyZeroCrossings(ZeroCrossings *zero_crossings)

{
  undefined8 *in_RDI;
  
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  if ((void *)in_RDI[3] != (void *)0x0) {
    operator_delete__((void *)in_RDI[3]);
  }
  if ((void *)in_RDI[6] != (void *)0x0) {
    operator_delete__((void *)in_RDI[6]);
  }
  if ((void *)in_RDI[9] != (void *)0x0) {
    operator_delete__((void *)in_RDI[9]);
  }
  if ((void *)in_RDI[1] != (void *)0x0) {
    operator_delete__((void *)in_RDI[1]);
  }
  if ((void *)in_RDI[4] != (void *)0x0) {
    operator_delete__((void *)in_RDI[4]);
  }
  if ((void *)in_RDI[7] != (void *)0x0) {
    operator_delete__((void *)in_RDI[7]);
  }
  if ((void *)in_RDI[10] != (void *)0x0) {
    operator_delete__((void *)in_RDI[10]);
  }
  return;
}

Assistant:

static void DestroyZeroCrossings(ZeroCrossings *zero_crossings) {
  delete[] zero_crossings->negative_interval_locations;
  delete[] zero_crossings->positive_interval_locations;
  delete[] zero_crossings->peak_interval_locations;
  delete[] zero_crossings->dip_interval_locations;
  delete[] zero_crossings->negative_intervals;
  delete[] zero_crossings->positive_intervals;
  delete[] zero_crossings->peak_intervals;
  delete[] zero_crossings->dip_intervals;
}